

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

string * __thiscall
tchecker::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tchecker *this,sync_id_t sync_id,system_t *system)

{
  synchronization_t *constraints;
  string *psVar1;
  ostream *poVar2;
  invalid_argument *this_00;
  undefined4 in_register_00000014;
  long lVar3;
  process_id_t *ppVar4;
  long lVar5;
  synchronization_t sync;
  stringstream ss;
  undefined1 local_218 [16];
  process_id_t *local_208;
  process_id_t *local_200;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar3 = CONCAT44(in_register_00000014,sync_id);
  constraints = tchecker::system::synchronizations_t::synchronization
                          ((synchronizations_t *)(lVar3 + 0x2d8),(sync_id_t)this);
  tchecker::system::synchronization_t::synchronization_t
            ((synchronization_t *)(local_218 + 8),constraints);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"<",1);
  if (local_208 != local_200) {
    lVar5 = 0;
    ppVar4 = local_208;
    do {
      if (lVar5 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,",",1);
      }
      psVar1 = tchecker::system::processes_t::process_name_abi_cxx11_
                         ((processes_t *)(lVar3 + 0x290),*ppVar4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"@",1);
      boost::container::dtl::
      flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::find((flat_tree<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::dtl::select1st<unsigned_int>,_std::less<unsigned_int>,_boost::container::new_allocator<boost::container::dtl::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_218,(key_type *)(lVar3 + 0x160));
      if ((pointer)local_218._0_8_ ==
          (pointer)(*(long *)(lVar3 + 0x168) * 0x28 + *(long *)(lVar3 + 0x160))) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"value is not indexed");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_218._0_8_ + 8))->_M_dataplus)._M_p,
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_218._0_8_ + 8))->_M_string_length);
      if (ppVar4[2] == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"?",1);
      }
      ppVar4 = ppVar4 + 3;
      lVar5 = lVar5 + -0xc;
    } while (ppVar4 != local_200);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,">",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  tchecker::system::synchronization_t::~synchronization_t((synchronization_t *)(local_218 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tchecker::sync_id_t sync_id, tchecker::system::system_t const & system)
{
  tchecker::system::synchronization_t sync = system.synchronization(sync_id);

  std::stringstream ss;
  ss << "<";
  auto r = sync.synchronization_constraints();
  for (auto it = r.begin(); it != r.end(); ++it) {
    if (it != r.begin())
      ss << ",";
    tchecker::system::sync_constraint_t const & constr = *it;
    ss << system.process_name(constr.pid()) << "@" << system.event_name(constr.event_id());
    if (constr.strength() == tchecker::SYNC_WEAK)
      ss << "?";
  }
  ss << ">";
  return ss.str();
}